

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteVmRelease(unqlite_vm *pVm)

{
  unqlite_vm *pVm_local;
  
  jx9_vm_release(pVm->pJx9Vm);
  SyMemBackendRelease(&pVm->sAlloc);
  return 0;
}

Assistant:

static int unqliteVmRelease(unqlite_vm *pVm)
{
	/* Release the Jx9 VM */
	jx9_vm_release(pVm->pJx9Vm);
	/* Release the private memory backend */
	SyMemBackendRelease(&pVm->sAlloc);
	/* Upper layer will discard this VM from the list
	 * of active VM.
	 */
	return UNQLITE_OK;
}